

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O3

void incdec_verify::PostDecTestUint8(void)

{
  uchar t;
  bool expected;
  long lVar1;
  string local_50;
  
  lVar1 = 2;
  do {
    t = (&UNK_0014d92e)[lVar1];
    if (t == '\0') {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    expected = (bool)(&dec_uint8)[lVar1];
    if (expected != true) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Error in case dec_uint8 throw (2): ","");
      err_msg<unsigned_char>(&local_50,t,expected);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    lVar1 = lVar1 + 3;
  } while (lVar1 != 0x1d);
  return;
}

Assistant:

void PostDecTestUint8()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_uint8); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint8_t> si(dec_uint8[i].x);
			SafeInt<std::uint8_t> vv = si--;

			if(vv != dec_uint8[i].x)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_uint8[i].fExpected )
		{
			err_msg( "Error in case dec_uint8 throw (2): ", dec_uint8[i].x, dec_uint8[i].fExpected );
		}
	}
}